

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type)

{
  PyTypeObject *type;
  anon_union_24_2_63b86169_for_instance_1 *paVar1;
  iterator it;
  values_and_holders vhs;
  allocator local_12a;
  allocator local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  iterator local_68;
  values_and_holders local_38;
  
  if ((find_type == (type_info *)0x0) || (type = (this->ob_base).ob_type, type == find_type->type))
  {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
    if ((this->field_0x30 & 2) == 0) {
      paVar1 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
    }
    else {
      paVar1 = &this->field_1;
    }
    __return_storage_ptr__->vh = (void **)paVar1;
  }
  else {
    local_38.inst = this;
    local_38.tinfo = all_type_info(type);
    values_and_holders::find(&local_68,&local_38,find_type);
    if (local_68.curr.index ==
        (long)((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)((local_38.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) {
      std::__cxx11::string::string((string *)&local_88,find_type->type->tp_name,&local_129);
      std::operator+(&local_108,"pybind11::detail::instance::get_value_and_holder: `",&local_88);
      std::operator+(&local_e8,&local_108,"\' is not a pybind11 base of the given `");
      std::__cxx11::string::string
                ((string *)&local_128,((this->ob_base).ob_type)->tp_name,&local_12a);
      std::operator+(&local_c8,&local_e8,&local_128);
      std::operator+(&local_a8,&local_c8,"\' instance");
      pybind11_fail(&local_a8);
    }
    __return_storage_ptr__->type = local_68.curr.type;
    __return_storage_ptr__->vh = local_68.curr.vh;
    __return_storage_ptr__->inst = local_68.curr.inst;
    __return_storage_ptr__->index = local_68.curr.index;
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            std::string(find_type->type->tp_name) + "' is not a pybind11 base of the given `" +
            std::string(Py_TYPE(this)->tp_name) + "' instance");
#endif
}